

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeH1.cpp
# Opt level: O1

void TPZShapeH1<pzshape::TPZShapePrism>::Shape(TPZVec<double> *pt,TPZShapeData *data)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  int nod;
  long lVar5;
  ulong uVar6;
  TPZTransform<double> *this;
  int d_1;
  long lVar7;
  int d;
  int side;
  long lVar8;
  int xj;
  long lVar9;
  TPZFNMatrix<1,_double> auxmat;
  TPZManVector<double,_3> outvec;
  TPZFNMatrix<100,_double> phin;
  TPZFNMatrix<100,_double> dphin;
  TPZFNMatrix<63,_double> phiblend;
  TPZFNMatrix<100,_double> dphiaux;
  TPZFNMatrix<63,_double> dphiblend;
  TPZFNMatrix<100,_double> dphiaux2;
  ulong local_15b0;
  long local_1580;
  TPZFMatrix<double> local_1508;
  double adStack_1478 [2];
  TPZManVector<double,_3> local_1468;
  TPZFMatrix<double> local_1430;
  double adStack_13a0 [101];
  TPZFMatrix<double> local_1078;
  double local_fe8 [101];
  TPZFMatrix<double> local_cc0;
  double local_c30 [64];
  TPZFMatrix<double> local_a30;
  double local_9a0 [101];
  TPZFMatrix<double> local_678;
  double local_5e8 [64];
  TPZFMatrix<double> local_3e8;
  double local_358 [101];
  
  pzshape::TPZShapePrism::ShapeCorner
            (pt,&(data->fPhi).super_TPZFMatrix<double>,&(data->fDPhi).super_TPZFMatrix<double>);
  if ((data->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow != 6) {
    local_cc0.fElem = local_c30;
    local_cc0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0x15;
    local_cc0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
    local_cc0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_cc0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_cc0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_018e3f28;
    local_cc0.fSize = 0x3f;
    local_cc0.fGiven = local_cc0.fElem;
    TPZVec<int>::TPZVec(&local_cc0.fPivot.super_TPZVec<int>,0);
    local_cc0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
    local_cc0.fPivot.super_TPZVec<int>.fStore = local_cc0.fPivot.fExtAlloc;
    local_cc0.fPivot.super_TPZVec<int>.fNElements = 0;
    local_cc0.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_cc0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
    local_cc0.fWork.fStore = (double *)0x0;
    local_cc0.fWork.fNElements = 0;
    local_cc0.fWork.fNAlloc = 0;
    local_cc0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_018e3c38;
    local_678.fElem = local_5e8;
    local_678.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
    local_678.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0x15;
    local_678.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_678.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_678.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_018e3f28;
    local_678.fSize = 0x3f;
    local_678.fGiven = local_678.fElem;
    TPZVec<int>::TPZVec(&local_678.fPivot.super_TPZVec<int>,0);
    local_678.fPivot.super_TPZVec<int>.fStore = local_678.fPivot.fExtAlloc;
    local_678.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
    local_678.fPivot.super_TPZVec<int>.fNElements = 0;
    local_678.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_678.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
    local_678.fWork.fStore = (double *)0x0;
    local_678.fWork.fNElements = 0;
    local_678.fWork.fNAlloc = 0;
    local_678.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_018e3c38;
    lVar7 = 0;
    lVar5 = 0;
    do {
      if (((data->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <=
           lVar5) ||
         ((data->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1
         )) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((local_cc0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar5) ||
         (local_cc0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      local_cc0.fElem[lVar5] = (data->fPhi).super_TPZFMatrix<double>.fElem[lVar5];
      lVar8 = 0;
      do {
        if (((data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow
             <= lVar8) ||
           ((data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol
            <= lVar5)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if ((local_678.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar8) ||
           (local_678.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar5)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        *(undefined8 *)
         ((long)local_678.fElem +
         lVar8 * 8 + local_678.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar7) =
             *(undefined8 *)
              ((long)(data->fDPhi).super_TPZFMatrix<double>.fElem +
              lVar8 * 8 +
              (data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
              fRow * lVar7);
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      lVar5 = lVar5 + 1;
      lVar7 = lVar7 + 8;
    } while (lVar5 != 6);
    pzshape::TPZShapePrism::ShapeGenerating(pt,&local_cc0,&local_678);
    local_15b0 = 6;
    lVar5 = 6;
    local_1580 = 0x30;
    do {
      side = (int)lVar5;
      uVar1 = pzshape::TPZShapePrism::NConnectShapeF
                        (side,(data->fH1ConnectOrders).super_TPZVec<int>.fStore[lVar5 + -6]);
      if (uVar1 != 0) {
        if ((local_cc0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar5) ||
           (local_cc0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar7 = (long)(int)local_15b0;
        if ((((int)local_15b0 < 0) ||
            ((data->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow
             <= lVar7)) ||
           ((data->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <
            1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        (data->fPhi).super_TPZFMatrix<double>.fElem[lVar7] = local_cc0.fElem[lVar5];
        lVar8 = 0;
        do {
          if ((local_678.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar8) ||
             (local_678.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar5)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if ((((data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
                fRow <= lVar8) || ((int)local_15b0 < 0)) ||
             ((data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
              fCol <= lVar7)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          (data->fDPhi).super_TPZFMatrix<double>.fElem
          [(data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow *
           lVar7 + lVar8] =
               *(double *)
                ((long)local_678.fElem +
                lVar8 * 8 + local_678.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * local_1580)
          ;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 3);
        uVar2 = (int)local_15b0 + 1;
        local_15b0 = (ulong)uVar2;
        if (uVar1 != 1) {
          this = (data->fSideTransforms).super_TPZVec<TPZTransform<double>_>.fStore + lVar5 + -6;
          iVar3 = pztopology::TPZPrism::SideDimension(side);
          lVar7 = (long)(int)uVar1;
          local_1430.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
          local_1430.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
          local_1430.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
          local_1430.fSize = 100;
          local_1430.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
               (_func_int **)&PTR__TPZFMatrix_0185f360;
          local_1430.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar7;
          local_1430.fElem = adStack_13a0;
          local_1430.fGiven = adStack_13a0;
          TPZVec<int>::TPZVec(&local_1430.fPivot.super_TPZVec<int>,0);
          local_1430.fPivot.super_TPZVec<int>._vptr_TPZVec =
               (_func_int **)&PTR__TPZManVector_0183cde8;
          local_1430.fPivot.super_TPZVec<int>.fStore = local_1430.fPivot.fExtAlloc;
          local_1430.fPivot.super_TPZVec<int>.fNElements = 0;
          local_1430.fPivot.super_TPZVec<int>.fNAlloc = 0;
          local_1430.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
          local_1430.fWork.fStore = (double *)0x0;
          local_1430.fWork.fNElements = 0;
          local_1430.fWork.fNAlloc = 0;
          if (100 < (int)uVar1) {
            local_1430.fElem = (double *)operator_new__(lVar7 * 8);
          }
          local_1430.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
               (_func_int **)&PTR__TPZFNMatrix_0185f070;
          lVar8 = (long)iVar3;
          local_1078.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
          local_1078.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
          local_1078.fSize = 100;
          local_1078.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
               (_func_int **)&PTR__TPZFMatrix_0185f360;
          local_1078.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar8;
          local_1078.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar7;
          local_1078.fElem = local_fe8;
          local_1078.fGiven = local_fe8;
          TPZVec<int>::TPZVec(&local_1078.fPivot.super_TPZVec<int>,0);
          local_1078.fPivot.super_TPZVec<int>._vptr_TPZVec =
               (_func_int **)&PTR__TPZManVector_0183cde8;
          local_1078.fPivot.super_TPZVec<int>.fStore = local_1078.fPivot.fExtAlloc;
          local_1078.fPivot.super_TPZVec<int>.fNElements = 0;
          local_1078.fPivot.super_TPZVec<int>.fNAlloc = 0;
          local_1078.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
          local_1078.fWork.fStore = (double *)0x0;
          local_1078.fWork.fNElements = 0;
          local_1078.fWork.fNAlloc = 0;
          if (iVar3 == 0) {
            local_1078.fElem = (double *)0x0;
          }
          else {
            uVar4 = lVar8 * lVar7;
            if (100 < (long)uVar4) {
              uVar6 = uVar4 * 8;
              if (0x1fffffffffffffff < uVar4) {
                uVar6 = 0xffffffffffffffff;
              }
              local_1078.fElem = (double *)operator_new__(uVar6);
            }
          }
          local_1078.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
               (_func_int **)&PTR__TPZFNMatrix_0185f070;
          local_a30.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
          local_a30.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
          local_a30.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
          local_a30.fSize = 100;
          local_a30.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
               (_func_int **)&PTR__TPZFMatrix_0185f360;
          local_a30.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar7;
          local_a30.fElem = local_9a0;
          local_a30.fGiven = local_9a0;
          TPZVec<int>::TPZVec(&local_a30.fPivot.super_TPZVec<int>,0);
          local_a30.fPivot.super_TPZVec<int>._vptr_TPZVec =
               (_func_int **)&PTR__TPZManVector_0183cde8;
          local_a30.fPivot.super_TPZVec<int>.fStore = local_a30.fPivot.fExtAlloc;
          local_a30.fPivot.super_TPZVec<int>.fNElements = 0;
          local_a30.fPivot.super_TPZVec<int>.fNAlloc = 0;
          local_a30.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
          local_a30.fWork.fStore = (double *)0x0;
          local_a30.fWork.fNElements = 0;
          local_a30.fWork.fNAlloc = 0;
          if (0x21 < (int)uVar1) {
            uVar4 = lVar7 * 0x18;
            if (0x1fffffffffffffff < (ulong)(lVar7 * 3)) {
              uVar4 = 0xffffffffffffffff;
            }
            local_a30.fElem = (double *)operator_new__(uVar4);
          }
          local_a30.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
               (_func_int **)&PTR__TPZFNMatrix_0185f070;
          local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
          local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
          local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
          local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
               (_func_int **)&PTR__TPZFMatrix_0185f360;
          local_3e8.fSize = 100;
          local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar7;
          local_3e8.fElem = local_358;
          local_3e8.fGiven = local_358;
          TPZVec<int>::TPZVec(&local_3e8.fPivot.super_TPZVec<int>,0);
          local_3e8.fPivot.super_TPZVec<int>._vptr_TPZVec =
               (_func_int **)&PTR__TPZManVector_0183cde8;
          local_3e8.fPivot.super_TPZVec<int>.fStore = local_3e8.fPivot.fExtAlloc;
          local_3e8.fPivot.super_TPZVec<int>.fNElements = 0;
          local_3e8.fPivot.super_TPZVec<int>.fNAlloc = 0;
          local_3e8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
          local_3e8.fWork.fStore = (double *)0x0;
          local_3e8.fWork.fNElements = 0;
          local_3e8.fWork.fNAlloc = 0;
          if (0x21 < (int)uVar1) {
            uVar4 = lVar7 * 0x18;
            if (0x1fffffffffffffff < (ulong)(lVar7 * 3)) {
              uVar4 = 0xffffffffffffffff;
            }
            local_3e8.fElem = (double *)operator_new__(uVar4);
          }
          local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
               (_func_int **)&PTR__TPZFNMatrix_0185f070;
          TPZManVector<double,_3>::TPZManVector(&local_1468,lVar8);
          TPZTransform<double>::Apply(this,pt,&local_1468.super_TPZVec<double>);
          pzshape::TPZShapePrism::ShapeInternal
                    (side,&local_1468.super_TPZVec<double>,
                     (data->fH1ConnectOrders).super_TPZVec<int>.fStore[lVar5 + -6],&local_1430,
                     &local_1078);
          if (iVar3 < 3) {
            local_1508.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 1;
            local_1508.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
            local_1508.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
            local_1508.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
            local_1508.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
                 = (_func_int **)&PTR__TPZFMatrix_018e21e8;
            local_1508.fSize = 1;
            local_1508.fElem = adStack_1478;
            local_1508.fGiven = adStack_1478;
            TPZVec<int>::TPZVec(&local_1508.fPivot.super_TPZVec<int>,0);
            local_1508.fPivot.super_TPZVec<int>._vptr_TPZVec =
                 (_func_int **)&PTR__TPZManVector_0183cde8;
            local_1508.fPivot.super_TPZVec<int>.fStore = local_1508.fPivot.fExtAlloc;
            local_1508.fPivot.super_TPZVec<int>.fNElements = 0;
            local_1508.fPivot.super_TPZVec<int>.fNAlloc = 0;
            local_1508.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
            local_1508.fWork.fStore = (double *)0x0;
            local_1508.fWork.fNElements = 0;
            local_1508.fWork.fNAlloc = 0;
            local_1508.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
                 = (_func_int **)&PTR__TPZFNMatrix_018e1ef8;
            TPZFMatrix<double>::operator=(&local_1508,0.0);
            (*(this->fMult).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
              super_TPZSavable._vptr_TPZSavable[0x27])
                      (0x3ff0000000000000,0,&this->fMult,&local_1078,&local_1508,&local_a30,1);
            if (1 < (int)uVar1) {
              local_15b0 = (ulong)(int)uVar2;
              lVar7 = local_15b0 * 8;
              uVar4 = 1;
              lVar8 = 8;
              do {
                if ((local_cc0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar5) ||
                   (local_cc0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                if ((local_1430.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar4) ||
                   (local_1430.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                if ((((long)local_15b0 < 0) ||
                    ((data->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                     super_TPZBaseMatrix.fRow <= (long)local_15b0)) ||
                   ((data->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                    super_TPZBaseMatrix.fCol < 1)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                (data->fPhi).super_TPZFMatrix<double>.fElem[local_15b0] =
                     local_cc0.fElem[lVar5] * local_1430.fElem[uVar4];
                lVar9 = 0;
                do {
                  if ((local_678.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar9) ||
                     (local_678.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar5)) {
                    TPZFMatrix<double>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  if ((local_1430.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar4)
                     || (local_1430.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                    TPZFMatrix<double>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  if ((local_cc0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar5) ||
                     (local_cc0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                    TPZFMatrix<double>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  if ((local_a30.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar9) ||
                     (local_a30.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar4)) {
                    TPZFMatrix<double>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  if ((((data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                        super_TPZBaseMatrix.fRow <= lVar9) || ((long)local_15b0 < 0)) ||
                     ((data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                      super_TPZBaseMatrix.fCol <= (long)local_15b0)) {
                    TPZFMatrix<double>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  *(double *)
                   ((long)(data->fDPhi).super_TPZFMatrix<double>.fElem +
                   lVar9 * 8 +
                   (data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                   super_TPZBaseMatrix.fRow * lVar7) =
                       *(double *)
                        ((long)local_678.fElem +
                        lVar9 * 8 +
                        local_678.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * local_1580) *
                       local_1430.fElem[uVar4] +
                       local_cc0.fElem[lVar5] *
                       *(double *)
                        ((long)local_a30.fElem +
                        lVar9 * 8 +
                        local_a30.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar8);
                  lVar9 = lVar9 + 1;
                } while (lVar9 != 3);
                local_15b0 = local_15b0 + 1;
                uVar4 = uVar4 + 1;
                lVar7 = lVar7 + 8;
                lVar8 = lVar8 + 8;
              } while (uVar4 != uVar1);
            }
            TPZFMatrix<double>::~TPZFMatrix(&local_1508,&PTR_PTR_018e21b0);
          }
          else if (1 < (int)uVar1) {
            local_15b0 = (ulong)(int)uVar2;
            lVar7 = local_15b0 * 8;
            uVar4 = 1;
            lVar8 = 8;
            do {
              if ((local_cc0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar5) ||
                 (local_cc0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if ((local_1430.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar4) ||
                 (local_1430.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if ((((long)local_15b0 < 0) ||
                  ((data->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix
                   .fRow <= (long)local_15b0)) ||
                 ((data->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
                  fCol < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              (data->fPhi).super_TPZFMatrix<double>.fElem[local_15b0] =
                   local_cc0.fElem[lVar5] * local_1430.fElem[uVar4];
              lVar9 = 0;
              do {
                if ((local_678.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar9) ||
                   (local_678.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar5)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                if ((local_1430.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar4) ||
                   (local_1430.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                if ((local_cc0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar5) ||
                   (local_cc0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                if ((local_1078.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar9) ||
                   (local_1078.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar4)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                if ((((data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                      super_TPZBaseMatrix.fRow <= lVar9) || ((long)local_15b0 < 0)) ||
                   ((data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                    super_TPZBaseMatrix.fCol <= (long)local_15b0)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                *(double *)
                 ((long)(data->fDPhi).super_TPZFMatrix<double>.fElem +
                 lVar9 * 8 +
                 (data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
                 fRow * lVar7) =
                     *(double *)
                      ((long)local_678.fElem +
                      lVar9 * 8 +
                      local_678.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * local_1580) *
                     local_1430.fElem[uVar4] +
                     local_cc0.fElem[lVar5] *
                     *(double *)
                      ((long)local_1078.fElem +
                      lVar9 * 8 +
                      local_1078.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar8);
                lVar9 = lVar9 + 1;
              } while (lVar9 != 3);
              local_15b0 = local_15b0 + 1;
              uVar4 = uVar4 + 1;
              lVar7 = lVar7 + 8;
              lVar8 = lVar8 + 8;
            } while (uVar4 != uVar1);
          }
          TPZManVector<double,_3>::~TPZManVector(&local_1468);
          TPZFMatrix<double>::~TPZFMatrix(&local_3e8,&PTR_PTR_0185f328);
          TPZFMatrix<double>::~TPZFMatrix(&local_a30,&PTR_PTR_0185f328);
          TPZFMatrix<double>::~TPZFMatrix(&local_1078,&PTR_PTR_0185f328);
          TPZFMatrix<double>::~TPZFMatrix(&local_1430,&PTR_PTR_0185f328);
        }
      }
      lVar5 = lVar5 + 1;
      local_1580 = local_1580 + 8;
    } while (lVar5 != 0x15);
    TPZFMatrix<double>::~TPZFMatrix(&local_678,&PTR_PTR_018e3ef0);
    TPZFMatrix<double>::~TPZFMatrix(&local_cc0,&PTR_PTR_018e3ef0);
  }
  return;
}

Assistant:

void TPZShapeH1<TSHAPE>::Shape(const TPZVec<REAL> &pt, TPZShapeData &data) {

    
//    TPZVec<REAL> &pt = par.pt;
//    TPZFMatrix<REAL> &phi = par.phi;
//    TPZFMatrix<REAL> &dphi = par.dphi;
    
    TSHAPE::ShapeCorner(pt,data.fPhi,data.fDPhi);
    
    if(data.fPhi.Rows() == TSHAPE::NCornerNodes) return;
    
    const int dim = TSHAPE::Dimension;
    const int NSides = TSHAPE::NSides;
    const int NCorners = TSHAPE::NCornerNodes;

    TPZFNMatrix<NSides*dim,REAL> phiblend(NSides,1),dphiblend(dim,NSides);
    for(int nod=0; nod<NCorners; nod++)
    {
        phiblend(nod,0) = data.fPhi(nod,0);
        for(int d=0; d< dim; d++)
        {
            dphiblend(d,nod) = data.fDPhi(d,nod);
        }
    }
    TSHAPE::ShapeGenerating(pt, phiblend, dphiblend);
    int shape = NCorners;
    for (int side = NCorners; side<NSides ; side++)
    {
        int numshape = TSHAPE::NConnectShapeF(side, data.fH1ConnectOrders[side-NCorners]);
        if(numshape == 0) continue;
        
        data.fPhi(shape,0) = phiblend(side,0);
        for(int d=0; d<dim; d++) data.fDPhi(d,shape) = dphiblend(d,side);
        shape++;
        
        if(numshape == 1) continue;
        
        TPZTransform<REAL> &transform = data.fSideTransforms[side - NCorners];
        int sidedim = TSHAPE::SideDimension(side);
        TPZFNMatrix<100,REAL> phin(numshape,1), dphin(sidedim,numshape), dphiaux(TSHAPE::Dimension,numshape),
            dphiaux2(TSHAPE::Dimension,numshape);
        TPZManVector<REAL,3> outvec(sidedim);
        transform.Apply(pt, outvec);
//        dphin.Zero();
        TSHAPE::ShapeInternal(side, outvec,data.fH1ConnectOrders[side - NCorners], phin, dphin);
        if(sidedim < 3)
        {
            constexpr REAL alpha = 1.;
            constexpr REAL beta = 0.;
            constexpr int opt = 1;
            TPZFNMatrix<1,REAL> auxmat(1,1,0);    
            TPZFMatrix<REAL> &mult = transform.Mult();
            mult.MultAdd(dphin, auxmat, dphiaux,alpha,beta,opt);
            
            for (int i = 1; i < numshape; i++) {
                data.fPhi(shape,0) = phiblend(side,0)*phin(i,0);
                for(int xj=0;xj<TSHAPE::Dimension;xj++) {
                    data.fDPhi(xj,shape) = dphiblend(xj,side)*phin(i,0)+phiblend(side,0)*dphiaux(xj,i);
                }
                shape++;
            }
        } else
        {
            for (int i = 1; i < numshape; i++) {
                data.fPhi(shape,0) = phiblend(side,0)*phin(i,0);
                for(int xj=0;xj<TSHAPE::Dimension;xj++) {
                    data.fDPhi(xj,shape) = dphiblend(xj,side)*phin(i,0)+phiblend(side,0)*dphin(xj,i);
                }
                shape++;
            }

        }
    }
    
}